

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

PixelBufferAccess *
tcu::getEffectiveDepthStencilAccess
          (PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *baseAccess,
          DepthStencilMode mode)

{
  ChannelType CVar1;
  void *data;
  TextureFormat local_10;
  
  CVar1 = (baseAccess->super_ConstPixelBufferAccess).m_format.type;
  if (CVar1 == UNSIGNED_INT_16_8_8) {
    if (mode != MODE_STENCIL) {
      if (mode != MODE_DEPTH) goto LAB_001f7728;
      local_10.order = D;
      local_10.type = UNORM_INT16;
      data = (void *)((long)(baseAccess->super_ConstPixelBufferAccess).m_data + 2);
      goto LAB_001f775d;
    }
LAB_001f773f:
    local_10.order = S;
    local_10.type = UNSIGNED_INT8;
  }
  else {
    if (CVar1 == UNSIGNED_INT_24_8) {
      if (mode != MODE_STENCIL) {
        if (mode != MODE_DEPTH) goto LAB_001f7728;
        local_10.order = D;
        local_10.type = UNORM_INT24;
        data = (void *)((long)(baseAccess->super_ConstPixelBufferAccess).m_data + 1);
        goto LAB_001f775d;
      }
      goto LAB_001f773f;
    }
    if (CVar1 == UNSIGNED_INT_24_8_REV) {
      if (mode == MODE_STENCIL) {
        local_10.order = S;
        local_10.type = UNSIGNED_INT8;
        data = (void *)((long)(baseAccess->super_ConstPixelBufferAccess).m_data + 3);
        goto LAB_001f775d;
      }
      if (mode != MODE_DEPTH) goto LAB_001f7728;
      local_10.order = D;
      local_10.type = UNORM_INT24;
    }
    else {
      if (CVar1 != FLOAT_UNSIGNED_INT_24_8_REV) {
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&__return_storage_ptr__->super_ConstPixelBufferAccess,
                   &baseAccess->super_ConstPixelBufferAccess);
        return __return_storage_ptr__;
      }
      if (mode == MODE_STENCIL) {
        local_10.order = S;
        local_10.type = UNSIGNED_INT8;
        data = (void *)((long)(baseAccess->super_ConstPixelBufferAccess).m_data + 4);
        goto LAB_001f775d;
      }
      if (mode != MODE_DEPTH) {
LAB_001f7728:
        ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&__return_storage_ptr__->super_ConstPixelBufferAccess);
        return __return_storage_ptr__;
      }
      local_10.order = D;
      local_10.type = FLOAT;
    }
  }
  data = (baseAccess->super_ConstPixelBufferAccess).m_data;
LAB_001f775d:
  PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,&local_10,&(baseAccess->super_ConstPixelBufferAccess).m_size,
             &(baseAccess->super_ConstPixelBufferAccess).m_pitch,data);
  return __return_storage_ptr__;
}

Assistant:

PixelBufferAccess getEffectiveDepthStencilAccess (const PixelBufferAccess& baseAccess, Sampler::DepthStencilMode mode)
{
	return toSamplerAccess<PixelBufferAccess>(baseAccess, mode);
}